

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O2

ostream * tchecker::output(ostream *os,intval_t *intval,intvar_index_t *index)

{
  uint uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  int *piVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(index);
  uVar1 = 0;
  while (uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38), uVar1 < sVar2) {
    if (uVar1 != 0) {
      std::operator<<(os,",");
    }
    pbVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(index,(uint *)((long)&uStack_38 + 4));
    poVar4 = std::operator<<(os,(string *)pbVar3);
    poVar4 = std::operator<<(poVar4,"=");
    piVar5 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                       ((make_array_t<int,_4UL,_tchecker::intval_base_t> *)intval,uStack_38._4_2_);
    std::ostream::operator<<((ostream *)poVar4,*piVar5);
    uVar1 = uStack_38._4_4_ + 1;
  }
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::intval_t const & intval, tchecker::intvar_index_t const & index)
{
  auto const size = index.size();

  for (tchecker::intvar_id_t id = 0; id < size; ++id) {
    if (id > 0)
      os << ",";
    os << index.value(id) << "=" << intval[id];
  }
  return os;
}